

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disflow.c
# Opt level: O0

FlowField * alloc_flow_field(int frame_width,int frame_height)

{
  void *memblk;
  double *pdVar1;
  int in_ESI;
  int in_EDI;
  size_t flow_size;
  FlowField *flow;
  FlowField *local_8;
  
  local_8 = (FlowField *)aom_malloc(0x3a03f6);
  if (local_8 == (FlowField *)0x0) {
    local_8 = (FlowField *)0x0;
  }
  else {
    local_8->width = in_EDI >> 3;
    local_8->height = in_ESI >> 3;
    local_8->stride = local_8->width + 4;
    memblk = (void *)((long)local_8->stride * (long)(local_8->height + 4));
    pdVar1 = (double *)aom_calloc((size_t)local_8,(size_t)memblk);
    local_8->buf0 = pdVar1;
    if (local_8->buf0 == (double *)0x0) {
      aom_free(memblk);
      local_8 = (FlowField *)0x0;
    }
    else {
      local_8->u = local_8->buf0 + (long)(local_8->stride << 1) + 2;
      local_8->v = local_8->u + (long)memblk;
    }
  }
  return local_8;
}

Assistant:

static FlowField *alloc_flow_field(int frame_width, int frame_height) {
  FlowField *flow = (FlowField *)aom_malloc(sizeof(FlowField));
  if (flow == NULL) return NULL;

  // Calculate the size of the bottom (largest) layer of the flow pyramid
  flow->width = frame_width >> DOWNSAMPLE_SHIFT;
  flow->height = frame_height >> DOWNSAMPLE_SHIFT;
  flow->stride = flow->width + 2 * FLOW_BORDER_OUTER;

  const size_t flow_size =
      flow->stride * (size_t)(flow->height + 2 * FLOW_BORDER_OUTER);

  flow->buf0 = aom_calloc(2 * flow_size, sizeof(*flow->buf0));
  if (!flow->buf0) {
    aom_free(flow);
    return NULL;
  }

  flow->u = flow->buf0 + FLOW_BORDER_OUTER * flow->stride + FLOW_BORDER_OUTER;
  flow->v = flow->u + flow_size;

  return flow;
}